

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void accumulate(vector<double,_std::allocator<double>_> *output,
               vector<double,_std::allocator<double>_> *input)

{
  double dVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t x;
  size_type in_stack_ffffffffffffffe8;
  ulong uVar6;
  ulong __n;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar2 < sVar3) {
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    std::vector<double,_std::allocator<double>_>::resize(in_RSI,in_stack_ffffffffffffffe8);
  }
  uVar6 = 0;
  while( true ) {
    __n = uVar6;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar2 <= uVar6) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,__n);
    dVar1 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,__n);
    *pvVar5 = dVar1 + *pvVar5;
    uVar6 = __n + 1;
  }
  return;
}

Assistant:

void
accumulate (vector<double>& output, const vector<double>& input)
{
    if (output.size () < input.size ()) { output.resize (input.size ()); }
    for (size_t x = 0; x < input.size (); ++x)
    {
        output[x] += input[x];
    }
}